

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O2

void align_limit_to_full_utf8_characters(char *from,char **fromLimRef)

{
  byte bVar1;
  char *pcVar2;
  long lVar3;
  
  pcVar2 = *fromLimRef;
  lVar3 = 0;
  do {
    if (pcVar2 <= from) {
LAB_0048ae36:
      *fromLimRef = pcVar2;
      return;
    }
    bVar1 = pcVar2[-1];
    if ((bVar1 & 0xf8) == 0xf0) {
      if (lVar3 - 3U < 0xfffffffffffffffc) {
        pcVar2 = pcVar2 + 3;
        goto LAB_0048ae36;
      }
LAB_0048ae17:
      lVar3 = 0;
    }
    else {
      if ((bVar1 & 0xf0) == 0xe0) {
        if (0xfffffffffffffffc < lVar3 - 2U) goto LAB_0048ae17;
        pcVar2 = pcVar2 + 2;
        goto LAB_0048ae36;
      }
      if ((bVar1 & 0xe0) == 0xc0) {
        if (0xfffffffffffffffd < lVar3 - 1U) goto LAB_0048ae17;
        pcVar2 = pcVar2 + 1;
        goto LAB_0048ae36;
      }
      if (-1 < (char)bVar1) goto LAB_0048ae36;
    }
    pcVar2 = pcVar2 + -1;
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

void
align_limit_to_full_utf8_characters(const char * from, const char ** fromLimRef)
{
  const char * fromLim = *fromLimRef;
  size_t walked = 0;
  for (; fromLim > from; fromLim--, walked++) {
    const unsigned char prev = (unsigned char)fromLim[-1];
    if ((prev & 0xf8u) == 0xf0u) { /* 4-byte character, lead by 0b11110xxx byte */
      if (walked + 1 >= 4) {
        fromLim += 4 - 1;
        break;
      } else {
        walked = 0;
      }
    } else if ((prev & 0xf0u) == 0xe0u) { /* 3-byte character, lead by 0b1110xxxx byte */
      if (walked + 1 >= 3) {
        fromLim += 3 - 1;
        break;
      } else {
        walked = 0;
      }
    } else if ((prev & 0xe0u) == 0xc0u) { /* 2-byte character, lead by 0b110xxxxx byte */
      if (walked + 1 >= 2) {
        fromLim += 2 - 1;
        break;
      } else {
        walked = 0;
      }
    } else if ((prev & 0x80u) == 0x00u) { /* 1-byte character, matching 0b0xxxxxxx */
      break;
    }
  }
  *fromLimRef = fromLim;
}